

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O1

void Abc_FrameDeleteAllNetworks(Abc_Frame_t *p)

{
  Abc_Ntk_t *pAVar1;
  Abc_Ntk_t *pNtk;
  
  pNtk = p->pNtkCur;
  while (pNtk != (Abc_Ntk_t *)0x0) {
    pAVar1 = pNtk->pNetBackup;
    Abc_NtkDelete(pNtk);
    pNtk = pAVar1;
  }
  p->pNtkCur = (Abc_Ntk_t *)0x0;
  Gia_ManStopP(&p->pGia);
  Gia_ManStopP(&p->pGia2);
  Gia_ManStopP(&p->pGiaBest);
  Gia_ManStopP(&p->pGiaBest2);
  Gia_ManStopP(&p->pGiaSaved);
  return;
}

Assistant:

void Abc_FrameDeleteAllNetworks( Abc_Frame_t * p )
{
    Abc_Ntk_t * pNtk, * pNtk2;
    // delete all the currently saved networks
    for ( pNtk  = p->pNtkCur, 
          pNtk2 = pNtk? Abc_NtkBackup(pNtk): NULL; 
          pNtk; 
          pNtk  = pNtk2, 
          pNtk2 = pNtk? Abc_NtkBackup(pNtk): NULL )
        Abc_NtkDelete( pNtk );
    // set the current network empty
    p->pNtkCur = NULL;
//    fprintf( p->Out, "All networks have been deleted.\n" );
    Gia_ManStopP( &p->pGia );
    Gia_ManStopP( &p->pGia2 );
    Gia_ManStopP( &p->pGiaBest );
    Gia_ManStopP( &p->pGiaBest2 );
    Gia_ManStopP( &p->pGiaSaved );
}